

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
parse_mods_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  bool localset;
  syntax_option_type flag;
  undefined8 in_stack_ffffffffffffff58;
  source_location *this_00;
  undefined4 in_stack_ffffffffffffff60;
  regex_error *in_stack_ffffffffffffff70;
  source_location local_80 [2];
  unsigned_long in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  byte bVar4;
  
  bVar4 = 1;
  do {
    iVar3 = (int)*(char *)*in_RSI;
    if (iVar3 == 0x29) {
      return token_no_mark;
    }
    if (iVar3 == 0x2d) {
      bVar1 = bVar4 ^ 0xff;
      bVar4 = bVar1 & 1;
      if ((bVar1 & 1) != 0) {
LAB_001417ea:
        regex_error::regex_error
                  (in_stack_ffffffffffffff70,(error_type)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(iVar3,in_stack_ffffffffffffff60));
        this_00 = local_80;
        source_location::source_location
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                   ,0x191,
                   "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::parse_mods_(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                   ,0);
        throw_exception<boost::xpressive::regex_error>
                  ((regex_error *)CONCAT44(iVar3,in_stack_ffffffffffffff60),this_00);
      }
    }
    else {
      if (iVar3 == 0x3a) {
        *in_RSI = *in_RSI + 1;
        return token_no_mark;
      }
      bVar2 = SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0);
      flag = (syntax_option_type)in_stack_ffffffffffffff58;
      if (iVar3 == 0x69) {
        compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::flag_((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *)CONCAT44(0x69,in_stack_ffffffffffffff60),bVar2,flag);
      }
      else if (iVar3 == 0x6d) {
        compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::flag_((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *)CONCAT44(0x6d,in_stack_ffffffffffffff60),bVar2,flag);
      }
      else if (iVar3 == 0x73) {
        compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::flag_((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *)CONCAT44(0x73,in_stack_ffffffffffffff60),bVar2,flag);
      }
      else {
        if (iVar3 != 0x78) goto LAB_001417ea;
        compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::flag_((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *)CONCAT44(0x78,in_stack_ffffffffffffff60),bVar2,flag);
      }
    }
    *in_RSI = *in_RSI + 1;
    bVar2 = detail::ensure_(SUB81((ulong)in_RDX >> 0x38,0),(error_type)in_RDX,
                            (char *)CONCAT17(bVar4,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                            in_stack_ffffffffffffffc0);
    if (!bVar2) {
      return token_no_mark;
    }
  } while( true );
}

Assistant:

regex_constants::compiler_token_type parse_mods_(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        bool localset = true;
        do switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, 'i'): this->flag_(localset, icase_); break;
        case BOOST_XPR_CHAR_(char_type, 'm'): this->flag_(!localset, single_line); break;
        case BOOST_XPR_CHAR_(char_type, 's'): this->flag_(!localset, not_dot_newline); break;
        case BOOST_XPR_CHAR_(char_type, 'x'): this->flag_(localset, ignore_white_space); break;
        case BOOST_XPR_CHAR_(char_type, ':'): ++begin; BOOST_FALLTHROUGH;
        case BOOST_XPR_CHAR_(char_type, ')'): return token_no_mark;
        case BOOST_XPR_CHAR_(char_type, '-'): if(false == (localset = !localset)) break; BOOST_FALLTHROUGH;
        default: BOOST_THROW_EXCEPTION(regex_error(error_paren, "unknown pattern modifier"));
        }
        while(BOOST_XPR_ENSURE_(++begin != end, error_paren, "incomplete extension"));
        // this return is technically unreachable, but this must
        // be here to work around a bug in gcc 4.0
        return token_no_mark;
    }